

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outmesh2medit(tetgenmesh *this,char *mfilename)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  long lVar8;
  long lVar9;
  point pdVar10;
  point pdVar11;
  point pt;
  int local_4b4;
  uint local_4b0;
  int i;
  int marker;
  int pointnumber;
  long faces;
  long ntets;
  point p4;
  point p3;
  point p2;
  point p1;
  point ptloop;
  face checkmark;
  face segloop;
  triface tsymface;
  triface tface;
  tetrahedron *tetptr;
  char mefilename [1024];
  FILE *outfile;
  char *mfilename_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&tsymface.ver);
  triface::triface((triface *)&segloop.shver);
  face::face((face *)&checkmark.shver);
  face::face((face *)&ptloop);
  if ((mfilename == (char *)0x0) || (*mfilename == '\0')) {
    if (this->b->outfilename[0] == '\0') {
      strcpy((char *)&tetptr,"unnamed");
    }
    else {
      strcpy((char *)&tetptr,this->b->outfilename);
    }
  }
  else {
    strcpy((char *)&tetptr,mfilename);
  }
  strcat((char *)&tetptr,".mesh");
  if (this->b->quiet == 0) {
    printf("Writing %s.\n",&tetptr);
  }
  __stream = fopen((char *)&tetptr,"w");
  if (__stream == (FILE *)0x0) {
    printf("File I/O Error:  Cannot create file %s.\n",&tetptr);
  }
  else {
    fprintf(__stream,"MeshVersionFormatted 1\n");
    fprintf(__stream,"\n");
    fprintf(__stream,"Dimension\n");
    fprintf(__stream,"3\n");
    fprintf(__stream,"\n");
    fprintf(__stream,"\n# Set of mesh vertices\n");
    fprintf(__stream,"Vertices\n");
    fprintf(__stream,"%ld\n",this->points->items);
    memorypool::traversalinit(this->points);
    p1 = pointtraverse(this);
    i = 1;
    while (p1 != (point)0x0) {
      fprintf(__stream,"%.17g  %.17g  %.17g",*p1,p1[1],p1[2]);
      if (this->in->numberofpointattributes < 1) {
        fprintf(__stream,"    0\n");
      }
      else {
        fprintf(__stream,"  %.17g\n",p1[3]);
      }
      setpointmark(this,p1,i);
      p1 = pointtraverse(this);
      i = i + 1;
    }
    lVar8 = this->tetrahedrons->items - this->hullsize;
    lVar9 = lVar8 * 4 + this->hullsize;
    fprintf(__stream,"\n# Set of Triangles\n",lVar9 % 2);
    fprintf(__stream,"Triangles\n");
    fprintf(__stream,"%ld\n",lVar9 / 2);
    memorypool::traversalinit(this->tetrahedrons);
    tsymface._8_8_ = tetrahedrontraverse(this);
    while (tsymface._8_8_ != 0) {
      for (tface.tet._0_4_ = 0; (int)tface.tet < 4; tface.tet._0_4_ = (int)tface.tet + 1) {
        fsym(this,(triface *)&tsymface.ver,(triface *)&segloop.shver);
        bVar1 = ishulltet(this,(triface *)&segloop.shver);
        if (bVar1) {
LAB_0017da26:
          pdVar10 = org(this,(triface *)&tsymface.ver);
          pdVar11 = dest(this,(triface *)&tsymface.ver);
          pt = apex(this,(triface *)&tsymface.ver);
          uVar4 = pointmark(this,pdVar10);
          uVar5 = pointmark(this,pdVar11);
          uVar6 = pointmark(this,pt);
          fprintf(__stream,"%5d  %5d  %5d",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
          tspivot(this,(triface *)&tsymface.ver,(face *)&ptloop);
          if (ptloop == (point)0x0) {
            local_4b0 = 0;
          }
          else {
            local_4b0 = shellmark(this,(face *)&ptloop);
          }
          fprintf(__stream,"    %d\n",(ulong)local_4b0);
        }
        else {
          iVar2 = elemindex(this,(tetrahedron *)tsymface._8_8_);
          iVar3 = elemindex(this,(tetrahedron *)segloop._8_8_);
          if (iVar2 < iVar3) goto LAB_0017da26;
        }
      }
      tsymface._8_8_ = tetrahedrontraverse(this);
    }
    fprintf(__stream,"\n# Set of Tetrahedra\n");
    fprintf(__stream,"Tetrahedra\n");
    fprintf(__stream,"%ld\n",lVar8);
    memorypool::traversalinit(this->tetrahedrons);
    tface._8_8_ = tetrahedrontraverse(this);
    while (tface._8_8_ != 0) {
      if (this->b->reversetetori == 0) {
        p2 = *(point *)(tface._8_8_ + 0x20);
        p3 = *(point *)(tface._8_8_ + 0x28);
      }
      else {
        p2 = *(point *)(tface._8_8_ + 0x28);
        p3 = *(point *)(tface._8_8_ + 0x20);
      }
      pdVar10 = *(point *)(tface._8_8_ + 0x30);
      pdVar11 = *(point *)(tface._8_8_ + 0x38);
      uVar4 = pointmark(this,p2);
      uVar5 = pointmark(this,p3);
      uVar6 = pointmark(this,pdVar10);
      uVar7 = pointmark(this,pdVar11);
      fprintf(__stream,"%5d  %5d  %5d  %5d",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
      if (this->numelemattrib < 1) {
        fprintf(__stream,"  0");
      }
      else {
        elemattribute(this,(tetrahedron *)tface._8_8_,0);
        fprintf(__stream,"  %.17g");
      }
      fprintf(__stream,"\n");
      tface._8_8_ = tetrahedrontraverse(this);
    }
    fprintf(__stream,"\nCorners\n");
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofpoints);
    for (local_4b4 = 0; local_4b4 < this->in->numberofpoints; local_4b4 = local_4b4 + 1) {
      fprintf(__stream,"%4d\n",(ulong)(local_4b4 + 1));
    }
    if ((this->b->plc != 0) || (this->b->refine != 0)) {
      fprintf(__stream,"\nEdges\n");
      fprintf(__stream,"%ld\n",this->subsegs->items);
      memorypool::traversalinit(this->subsegs);
      checkmark._8_8_ = shellfacetraverse(this,this->subsegs);
      while (checkmark._8_8_ != 0) {
        pdVar10 = sorg(this,(face *)&checkmark.shver);
        pdVar11 = sdest(this,(face *)&checkmark.shver);
        uVar4 = pointmark(this,pdVar10);
        uVar5 = pointmark(this,pdVar11);
        fprintf(__stream,"%5d  %5d",(ulong)uVar4,(ulong)uVar5);
        uVar4 = shellmark(this,(face *)&checkmark.shver);
        fprintf(__stream,"    %d\n",(ulong)uVar4);
        checkmark._8_8_ = shellfacetraverse(this,this->subsegs);
      }
    }
    fprintf(__stream,"\nEnd\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void tetgenmesh::outmesh2medit(char* mfilename)
{
  FILE *outfile;
  char mefilename[FILENAMESIZE];
  tetrahedron* tetptr;
  triface tface, tsymface;
  face segloop, checkmark;
  point ptloop, p1, p2, p3, p4;
  long ntets, faces;
  int pointnumber;
  int marker;
  int i;

  if (mfilename != (char *) NULL && mfilename[0] != '\0') {
    strcpy(mefilename, mfilename);
  } else if (b->outfilename[0] != '\0') {
    strcpy(mefilename, b->outfilename);
  } else {
    strcpy(mefilename, "unnamed");
  }
  strcat(mefilename, ".mesh");

  if (!b->quiet) {
    printf("Writing %s.\n", mefilename);
  }
  outfile = fopen(mefilename, "w");
  if (outfile == (FILE *) NULL) {
    printf("File I/O Error:  Cannot create file %s.\n", mefilename);
    return;
  }

  fprintf(outfile, "MeshVersionFormatted 1\n");
  fprintf(outfile, "\n");
  fprintf(outfile, "Dimension\n");
  fprintf(outfile, "3\n");
  fprintf(outfile, "\n");

  fprintf(outfile, "\n# Set of mesh vertices\n");
  fprintf(outfile, "Vertices\n");
  fprintf(outfile, "%ld\n", points->items);

  points->traversalinit();
  ptloop = pointtraverse();
  pointnumber = 1;                        // Medit need start number form 1.
  while (ptloop != (point) NULL) {
    // Point coordinates.
    fprintf(outfile, "%.17g  %.17g  %.17g", ptloop[0], ptloop[1], ptloop[2]);
    if (in->numberofpointattributes > 0) {
      // Write an attribute, ignore others if more than one.
      fprintf(outfile, "  %.17g\n", ptloop[3]);
    } else {
      fprintf(outfile, "    0\n");
    }
    setpointmark(ptloop, pointnumber);
    ptloop = pointtraverse();
    pointnumber++;
  }

  // Compute the number of faces.
  ntets = tetrahedrons->items - hullsize;
  faces = (ntets * 4l + hullsize) / 2l;

  fprintf(outfile, "\n# Set of Triangles\n");
  fprintf(outfile, "Triangles\n");
  fprintf(outfile, "%ld\n", faces);

  tetrahedrons->traversalinit();
  tface.tet = tetrahedrontraverse();
  while (tface.tet != (tetrahedron *) NULL) {
    for (tface.ver = 0; tface.ver < 4; tface.ver ++) {
      fsym(tface, tsymface);
      if (ishulltet(tsymface) || 
          (elemindex(tface.tet) < elemindex(tsymface.tet))) {
        p1 = org (tface);
        p2 = dest(tface);
        p3 = apex(tface);
        fprintf(outfile, "%5d  %5d  %5d",
                pointmark(p1), pointmark(p2), pointmark(p3));
        // Check if it is a subface.
        tspivot(tface, checkmark);
        if (checkmark.sh == NULL) {
          marker = 0;  // It is an inner face. It's marker is 0.
        } else {
          marker = shellmark(checkmark);
        }
        fprintf(outfile, "    %d\n", marker);
      }
    }
    tface.tet = tetrahedrontraverse();
  }

  fprintf(outfile, "\n# Set of Tetrahedra\n");
  fprintf(outfile, "Tetrahedra\n");
  fprintf(outfile, "%ld\n", ntets);

  tetrahedrons->traversalinit();
  tetptr = tetrahedrontraverse();
  while (tetptr != (tetrahedron *) NULL) {
    if (!b->reversetetori) {
      p1 = (point) tetptr[4];
      p2 = (point) tetptr[5];
    } else {
      p1 = (point) tetptr[5];
      p2 = (point) tetptr[4];
    }
    p3 = (point) tetptr[6];
    p4 = (point) tetptr[7];
    fprintf(outfile, "%5d  %5d  %5d  %5d",
            pointmark(p1), pointmark(p2), pointmark(p3), pointmark(p4));
    if (numelemattrib > 0) {
      fprintf(outfile, "  %.17g", elemattribute(tetptr, 0));
    } else {
      fprintf(outfile, "  0");
    }
    fprintf(outfile, "\n");
    tetptr = tetrahedrontraverse();
  }

  fprintf(outfile, "\nCorners\n");
  fprintf(outfile, "%d\n", in->numberofpoints);

  for (i = 0; i < in->numberofpoints; i++) {
    fprintf(outfile, "%4d\n", i + 1);
  }

  if (b->plc || b->refine) {
    fprintf(outfile, "\nEdges\n");
    fprintf(outfile, "%ld\n", subsegs->items);

    subsegs->traversalinit();
    segloop.sh = shellfacetraverse(subsegs);
    while (segloop.sh != (shellface *) NULL) {
      p1 = sorg(segloop);
      p2 = sdest(segloop);
      fprintf(outfile, "%5d  %5d", pointmark(p1), pointmark(p2));
      marker = shellmark(segloop);
      fprintf(outfile, "    %d\n", marker);
      segloop.sh = shellfacetraverse(subsegs);
    }
  }

  fprintf(outfile, "\nEnd\n");
  fclose(outfile);
}